

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_builder.h
# Opt level: O2

void BuilderTests<GrpcLikeMessageBuilder,_GrpcLikeMessageBuilder>::
     builder_movector_after_finish_test(void)

{
  FlatBufferBuilder *builder;
  uint val;
  bool val_00;
  Offset<MyGame::Example::Monster> root;
  string local_150;
  GrpcLikeMessageBuilder src;
  GrpcLikeMessageBuilder dst;
  
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&src);
  builder = &src.super_FlatBufferBuilder;
  root = populate1(builder);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Example::Monster>
            (builder,root,(char *)0x0);
  val = src.super_FlatBufferBuilder.buf_.size_;
  GrpcLikeMessageBuilder::GrpcLikeMessageBuilder(&dst,&src);
  TestEq<unsigned_int,unsigned_int>
            (dst.super_FlatBufferBuilder.buf_.size_,val,"\'dst.GetSize()\' != \'src_size\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x73,
             "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  m1_name_abi_cxx11_();
  val_00 = release_n_verify(&dst.super_FlatBufferBuilder,&local_150,Color_Red);
  TestEq<bool,bool>(true,val_00,"\'true\' != \'release_n_verify(dst, m1_name(), m1_color())\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
                    ,0x74,
                    "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
                   );
  std::__cxx11::string::~string((string *)&local_150);
  TestEq<unsigned_int,int>
            (src.super_FlatBufferBuilder.buf_.size_,0,"\'src.GetSize()\' != \'0\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/test_builder.h"
             ,0x75,
             "static void BuilderTests<GrpcLikeMessageBuilder>::builder_movector_after_finish_test() [DestBuilder = GrpcLikeMessageBuilder, SrcBuilder = GrpcLikeMessageBuilder]"
            );
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&dst.super_FlatBufferBuilder);
  flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(builder);
  return;
}

Assistant:

static void builder_movector_after_finish_test() {
    SrcBuilder src;
    auto root_offset1 = populate1(src);
    src.Finish(root_offset1);
    auto src_size = src.GetSize();
    DestBuilder dst(std::move(src));
    TEST_EQ_FUNC(dst.GetSize(), src_size);
    TEST_ASSERT_FUNC(release_n_verify(dst, m1_name(), m1_color()));
    TEST_EQ_FUNC(src.GetSize(), 0);
  }